

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c,SUNMatrix A)

{
  long lVar1;
  long lVar2;
  sunrealtype *A_colj;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  SUNMatrix A_local;
  sunrealtype c_local;
  
  for (j = 0; j < *(long *)((long)A->content + 8); j = j + 1) {
    lVar2 = *(long *)(*(long *)((long)A->content + 0x40) + j * 8) +
            *(long *)((long)A->content + 0x28) * 8;
    for (i = -*(long *)((long)A->content + 0x18); i <= *(long *)((long)A->content + 0x20); i = i + 1
        ) {
      *(double *)(lVar2 + i * 8) = c * *(double *)(lVar2 + i * 8);
    }
    lVar2 = *(long *)(*(long *)((long)A->content + 0x40) + j * 8);
    lVar1 = *(long *)((long)A->content + 0x28);
    *(double *)(lVar2 + lVar1 * 8) = *(double *)(lVar2 + lVar1 * 8) + 1.0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatScaleAddI_Band(sunrealtype c, SUNMatrix A)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j;
  sunrealtype* A_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* Perform operation */
  for (j = 0; j < SM_COLUMNS_B(A); j++)
  {
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { A_colj[i] *= c; }
    SM_ELEMENT_B(A, j, j) += ONE;
  }
  return SUN_SUCCESS;
}